

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-player-properties.c
# Opt level: O3

_Bool check_specialty_gain(int specialty)

{
  _Bool _Var1;
  
  _Var1 = flag_has_dbg(player->specialties,10,specialty,"player->specialties","specialty");
  if (_Var1) {
    return false;
  }
  _Var1 = flag_has_dbg(player->class->specialties,10,specialty,"player->class->specialties",
                       "specialty");
  return _Var1;
}

Assistant:

static bool check_specialty_gain(int specialty)
{
	/* Can't learn it if we already know it */
	if (pf_has(player->specialties, specialty)) {
		return false;
	}

	/* Is it allowed for this class? */
	if (pf_has(player->class->specialties, specialty)) {
		return true;
	}

	return false;
}